

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O0

BoxList * __thiscall amrex::BoxList::shiftHalf(BoxList *this,IntVect *iv)

{
  bool bVar1;
  iterator this_00;
  iterator nz;
  BoxList *in_RDI;
  Box *bx;
  iterator __end1;
  iterator __begin1;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  reference in_stack_ffffffffffffffd0;
  
  this_00 = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin
                      ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RDI);
  nz = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end
                 ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
         operator*((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                    *)&stack0xffffffffffffffe0);
    Box::shiftHalf(this_00._M_current,&(nz._M_current)->smallend);
    __gnu_cxx::
    __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator++((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                *)&stack0xffffffffffffffe0);
  }
  return in_RDI;
}

Assistant:

BoxList&
BoxList::shiftHalf (const IntVect& iv)
{
    for (auto& bx : m_lbox)
    {
        bx.shiftHalf(iv);
    }
    return *this;
}